

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledFont8x16.cxx
# Opt level: O3

OledPoint SSD1306::drawChar8x16(OledPoint *p,uint8_t c,PixelStyle style,OledPixel *oled)

{
  byte bVar1;
  PixelStyle style_00;
  PixelStyle PVar2;
  OledPoint OVar3;
  long lVar4;
  int16_t i;
  int iVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  OledPoint p_00;
  bool bVar7;
  
  PVar2 = oppositeStyle(style);
  lVar4 = 0;
  do {
    bVar1 = font8x16[lVar4 + (ulong)(uint)((int)CONCAT71(in_register_00000031,c) << 4)];
    if (bVar1 != 0) {
      iVar5 = 0;
      uVar6 = 7;
      do {
        p_00.m_x = p->m_x + iVar5;
        p_00.m_y = p->m_y + (int)lVar4;
        style_00 = style;
        if ((bVar1 >> (uVar6 & 0x1f) & 1) == 0) {
          style_00 = PVar2;
        }
        OledPixel::pixel(oled,p_00,style_00);
        iVar5 = iVar5 + 1;
        bVar7 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while (bVar7);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  OVar3.m_x = p->m_x + 8;
  OVar3.m_y = p->m_y;
  return OVar3;
}

Assistant:

SSD1306::OledPoint
SSD1306::drawChar8x16(
    const OledPoint& p,
    uint8_t c,
    PixelStyle style,
    OledPixel& oled)
{
    PixelStyle opposite = oppositeStyle(style);

    for (int16_t j = 0 ; j < sc_fontHeight8x16 ; ++j)
    {
        uint8_t byte = font8x16[c][j];

        if (byte != 0)
        {
            for (int16_t i = 0 ; i < sc_fontWidth8x16 ; ++i)
            {
                if ((byte >> (sc_fontWidth8x16 - i - 1)) & 1 )
                {
                    oled.pixel(OledPoint(p.x() + i, p.y() + j), style);
                }
                else
                {
                    oled.pixel(OledPoint(p.x() + i, p.y() + j), opposite);
                }
            }
        }
    }

    return OledPoint(p.x() + sc_fontWidth8x16, p.y());
}